

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::NormalGetFullPath
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          ArtifactType artifact,bool realname)

{
  bool bVar1;
  string local_1b8;
  string local_198;
  string local_178;
  cmAlphaNum local_158;
  string local_128;
  cmAlphaNum local_108;
  string local_d8;
  cmAlphaNum local_b8;
  string local_78;
  cmAlphaNum local_58;
  undefined1 local_26;
  byte local_25;
  ArtifactType local_24;
  bool realname_local;
  string *psStack_20;
  ArtifactType artifact_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  string *fpath;
  
  local_26 = 0;
  local_25 = realname;
  local_24 = artifact;
  psStack_20 = config;
  config_local = (string *)this;
  this_local = (cmGeneratorTarget *)__return_storage_ptr__;
  GetDirectory(&local_78,this,config,artifact);
  cmAlphaNum::cmAlphaNum(&local_58,&local_78);
  cmAlphaNum::cmAlphaNum(&local_b8,'/');
  cmStrCat<>(__return_storage_ptr__,&local_58,&local_b8);
  std::__cxx11::string::~string((string *)&local_78);
  bVar1 = IsAppBundleOnApple(this);
  if (bVar1) {
    BuildBundleDirectory(&local_128,this,__return_storage_ptr__,psStack_20,FullLevel);
    cmAlphaNum::cmAlphaNum(&local_108,&local_128);
    cmAlphaNum::cmAlphaNum(&local_158,'/');
    cmStrCat<>(&local_d8,&local_108,&local_158);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_128);
  }
  if (local_24 == RuntimeBinaryArtifact) {
    if ((local_25 & 1) == 0) {
      GetFullName(&local_198,this,psStack_20,RuntimeBinaryArtifact);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_198);
      std::__cxx11::string::~string((string *)&local_198);
    }
    else {
      NormalGetRealName(&local_178,this,psStack_20);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_178);
      std::__cxx11::string::~string((string *)&local_178);
    }
  }
  else if (local_24 == ImportLibraryArtifact) {
    GetFullName(&local_1b8,this,psStack_20,ImportLibraryArtifact);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::NormalGetFullPath(
  const std::string& config, cmStateEnums::ArtifactType artifact,
  bool realname) const
{
  std::string fpath = cmStrCat(this->GetDirectory(config, artifact), '/');
  if (this->IsAppBundleOnApple()) {
    fpath =
      cmStrCat(this->BuildBundleDirectory(fpath, config, FullLevel), '/');
  }

  // Add the full name of the target.
  switch (artifact) {
    case cmStateEnums::RuntimeBinaryArtifact:
      if (realname) {
        fpath += this->NormalGetRealName(config);
      } else {
        fpath +=
          this->GetFullName(config, cmStateEnums::RuntimeBinaryArtifact);
      }
      break;
    case cmStateEnums::ImportLibraryArtifact:
      fpath += this->GetFullName(config, cmStateEnums::ImportLibraryArtifact);
      break;
  }
  return fpath;
}